

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O1

void __thiscall PartVolumeButton::toggleSoloPart(PartVolumeButton *this,bool enabled)

{
  int iVar1;
  int newVolume;
  PartVolumeButton *this_00;
  int i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if ((enabled) && (uVar2 != (uint)this->partNum)) {
      this_00 = this->monitor->partVolumeButton[uVar2];
      if (0 < this_00->volume) {
        newVolume = -this_00->volume;
LAB_0015f0d2:
        handleVolumeChanged(this_00,newVolume);
      }
    }
    else {
      this_00 = this->monitor->partVolumeButton[uVar2];
      iVar1 = this_00->volume;
      if (iVar1 < 1) {
        newVolume = -iVar1;
        if (iVar1 == 0) {
          newVolume = 0x65;
        }
        goto LAB_0015f0d2;
      }
    }
    uVar2 = uVar2 + 1;
    if (uVar2 == 9) {
      return;
    }
  } while( true );
}

Assistant:

void PartVolumeButton::toggleSoloPart(bool enabled) {
	for (int i = 0; i < 9; i++) {
		if (enabled && i != partNum) {
			monitor.partVolumeButton[i]->mutePart();
		} else {
			monitor.partVolumeButton[i]->unmutePart();
		}
	}
}